

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O2

int duckdb::Comparators::CompareTuple
              (SBScanState *left,SBScanState *right,data_ptr_t *l_ptr,data_ptr_t *r_ptr,
              SortLayout *sort_layout,bool *external_sort)

{
  vector<unsigned_long,_true> *this;
  const_reference cVar1;
  int iVar2;
  const_reference pvVar3;
  data_ptr_t str1;
  data_ptr_t str2;
  ulong local_48;
  SBScanState *local_40;
  bool *local_38;
  
  str1 = *l_ptr;
  str2 = *r_ptr;
  this = &sort_layout->column_sizes;
  local_48 = 0;
  local_40 = right;
  local_38 = external_sort;
  while( true ) {
    if (sort_layout->column_count <= local_48) {
      return 0;
    }
    pvVar3 = vector<unsigned_long,_true>::get<true>(this,local_48);
    iVar2 = FastMemcmp(str1,str2,*pvVar3);
    if (iVar2 != 0) break;
    cVar1 = vector<bool,_true>::get<true>(&sort_layout->constant_size,local_48);
    if ((!cVar1) && (iVar2 = BreakBlobTie(&local_48,left,local_40,sort_layout,local_38), iVar2 != 0)
       ) {
      return iVar2;
    }
    pvVar3 = vector<unsigned_long,_true>::get<true>(this,local_48);
    str1 = str1 + *pvVar3;
    pvVar3 = vector<unsigned_long,_true>::get<true>(this,local_48);
    str2 = str2 + *pvVar3;
    local_48 = local_48 + 1;
  }
  return iVar2;
}

Assistant:

int Comparators::CompareTuple(const SBScanState &left, const SBScanState &right, const data_ptr_t &l_ptr,
                              const data_ptr_t &r_ptr, const SortLayout &sort_layout, const bool &external_sort) {
	// Compare the sorting columns one by one
	int comp_res = 0;
	data_ptr_t l_ptr_offset = l_ptr;
	data_ptr_t r_ptr_offset = r_ptr;
	for (idx_t col_idx = 0; col_idx < sort_layout.column_count; col_idx++) {
		comp_res = FastMemcmp(l_ptr_offset, r_ptr_offset, sort_layout.column_sizes[col_idx]);
		if (comp_res == 0 && !sort_layout.constant_size[col_idx]) {
			comp_res = BreakBlobTie(col_idx, left, right, sort_layout, external_sort);
		}
		if (comp_res != 0) {
			break;
		}
		l_ptr_offset += sort_layout.column_sizes[col_idx];
		r_ptr_offset += sort_layout.column_sizes[col_idx];
	}
	return comp_res;
}